

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O3

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateLookupByKey
          (KotlinKMPGenerator *this,FieldDef *key_field,StructDef *struct_def,CodeWriter *writer,
          IDLOptions *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  IdlNamer *pIVar2;
  ostream *poVar3;
  long *plVar4;
  size_type *psVar5;
  stringstream params;
  string local_270;
  string local_250;
  IDLOptions *local_230;
  CodeWriter *local_228;
  FieldDef *local_220;
  _Any_data local_218;
  code *local_208;
  code *local_200;
  long *local_1f8 [2];
  long local_1e8 [2];
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_230 = options;
  local_228 = writer;
  local_220 = key_field;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"obj: ",5);
  pIVar2 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_270,pIVar2,struct_def);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"?",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  paVar1 = &local_270.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar1) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"vectorLocation: Int, ",0x15);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"key: ",5);
  GenTypeGet_abi_cxx11_(&local_270,this,&(key_field->value).type);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar1) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"bb: ReadWriteBuffer",0x13);
  local_270._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"lookupByKey","");
  std::__cxx11::stringbuf::str();
  (*(pIVar2->super_Namer)._vptr_Namer[0xf])(local_1f8,pIVar2,struct_def);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_1f8);
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_250.field_2._M_allocated_capacity = *psVar5;
    local_250.field_2._8_8_ = plVar4[3];
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  }
  else {
    local_250.field_2._M_allocated_capacity = *psVar5;
    local_250._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_250._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_218._8_8_ = 0;
  local_218._M_unused._M_object = operator_new(0x20);
  *(FieldDef ***)local_218._M_unused._0_8_ = &local_220;
  *(CodeWriter **)((long)local_218._M_unused._0_8_ + 8) = local_228;
  *(KotlinKMPGenerator **)((long)local_218._M_unused._0_8_ + 0x10) = this;
  *(StructDef **)((long)local_218._M_unused._0_8_ + 0x18) = struct_def;
  local_200 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:704:23)>
              ::_M_invoke;
  local_208 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp:704:23)>
              ::_M_manager;
  GenerateFun(local_228,&local_270,&local_1d8,&local_250,(function<void_()> *)&local_218,
              local_230->gen_jvmstatic);
  if (local_208 != (code *)0x0) {
    (*local_208)(&local_218,&local_218,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar1) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void GenerateLookupByKey(FieldDef *key_field, StructDef &struct_def,
                           CodeWriter &writer, const IDLOptions options) const {
    std::stringstream params;
    params << "obj: " << namer_.Type(struct_def) << "?"
           << ", ";
    params << "vectorLocation: Int, ";
    params << "key: " << GenTypeGet(key_field->value.type) << ", ";
    params << "bb: ReadWriteBuffer";

    auto statements = [&]() {
      auto base_type = key_field->value.type.base_type;
      writer.SetValue("struct_name", namer_.Type(struct_def));
      if (base_type == BASE_TYPE_STRING) {
        writer += "val byteKey = key.encodeToByteArray()";
      }
      writer += "var span = bb.getInt(vectorLocation - 4)";
      writer += "var start = 0";
      writer += "while (span != 0) {";
      writer.IncrementIdentLevel();
      writer += "var middle = span / 2";
      writer +=
          "val tableOffset = indirect(vector"
          "Location + 4 * (start + middle), bb)";
      if (IsString(key_field->value.type)) {
        writer += "val comp = compareStrings(\\";
        writer += GenOffsetGetter(key_field) + "\\";
        writer += ", byteKey, bb)";
      } else {
        auto get_val = GenLookupByKey(key_field, "bb");
        writer += "val value = " + get_val;
        writer += "val comp = value.compareTo(key)";
      }
      writer += "when {";
      writer.IncrementIdentLevel();
      writer += "comp > 0 -> span = middle";
      writer += "comp < 0 -> {";
      writer.IncrementIdentLevel();
      writer += "middle++";
      writer += "start += middle";
      writer += "span -= middle";
      writer.DecrementIdentLevel();
      writer += "}";  // end comp < 0
      writer += "else -> {";
      writer.IncrementIdentLevel();
      writer += "return (obj ?: {{struct_name}}()).init(tableOffset, bb)";
      writer.DecrementIdentLevel();
      writer += "}";  // end else
      writer.DecrementIdentLevel();
      writer += "}";  // end when
      writer.DecrementIdentLevel();
      writer += "}";  // end while
      writer += "return null";
    };
    GenerateFun(writer, "lookupByKey", params.str(),
                namer_.Type(struct_def) + "?", statements,
                options.gen_jvmstatic);
  }